

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

const_iterator * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::upper_bound(const_iterator *__return_storage_ptr__,
             btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
             *this,key_type *key)

{
  inner_node *inner;
  leaf_node *plVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  plVar1 = (leaf_node *)this->m_root;
  if (plVar1 == (leaf_node *)0x0) {
    plVar1 = this->m_tailleaf;
    if (plVar1 != (leaf_node *)0x0) {
      uVar3 = (ulong)(plVar1->super_node).slotuse;
      goto LAB_00105efe;
    }
  }
  else {
    if ((plVar1->super_node).level != 0) {
      do {
        uVar3 = (ulong)(plVar1->super_node).slotuse;
        if (uVar3 == 0) {
          lVar4 = 0;
        }
        else {
          uVar5 = 0;
          do {
            uVar2 = uVar5;
            if (*key < plVar1->slotkey[uVar5 - 2]) break;
            uVar5 = uVar5 + 1;
            uVar2 = uVar3;
          } while (uVar3 != uVar5);
          lVar4 = (long)(int)uVar2;
        }
        plVar1 = (leaf_node *)plVar1->slotkey[lVar4 + 0xe];
      } while ((plVar1->super_node).level != 0);
    }
    uVar5 = (ulong)(plVar1->super_node).slotuse;
    if (uVar5 != 0) {
      uVar2 = 0;
      do {
        uVar3 = uVar2;
        if (*key < plVar1->slotkey[uVar2]) break;
        uVar2 = uVar2 + 1;
        uVar3 = uVar5;
      } while (uVar5 != uVar2);
      goto LAB_00105efe;
    }
  }
  uVar3 = 0;
LAB_00105efe:
  __return_storage_ptr__->currnode = plVar1;
  __return_storage_ptr__->currslot = (unsigned_short)uVar3;
  (__return_storage_ptr__->temp_value).first = 0.0;
  (__return_storage_ptr__->temp_value).second = (BufferNode<double,_long> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator upper_bound(const key_type& key) const
        {
            const node *n = m_root;
            if (!n) return end();

            while(!n->isleafnode())
            {
                const inner_node *inner = static_cast<const inner_node*>(n);
                int slot = find_upper(inner, key);

                n = inner->childid[slot];
            }

            const leaf_node *leaf = static_cast<const leaf_node*>(n);

            int slot = find_upper(leaf, key);
            return const_iterator(leaf, slot);
        }